

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lite_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::LiteTest_DynamicCastMessageInvalidReferenceType_Test::TestBody
          (LiteTest_DynamicCastMessageInvalidReferenceType_Test *this)

{
  bool bVar1;
  AssertHelper local_3a0;
  char *local_398;
  undefined8 local_390;
  char local_388 [16];
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_378 [4];
  CastType1 test_type_1;
  
  proto2_unittest::TestAllTypesLite::TestAllTypesLite(&test_type_1);
  local_398 = local_388;
  local_388[0] = '\0';
  local_388[1] = '\0';
  local_388[2] = '\0';
  local_388[3] = '\0';
  local_388[4] = '\0';
  local_388[5] = '\0';
  local_388[6] = '\0';
  local_388[7] = '\0';
  local_388[8] = '\0';
  local_388[9] = '\0';
  local_388[10] = '\0';
  local_388[0xb] = '\0';
  local_388[0xc] = '\0';
  local_388[0xd] = '\0';
  local_388[0xe] = '\0';
  local_388[0xf] = '\0';
  local_390 = 0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    DynamicCastMessage<proto2_unittest::TestPackedTypesLite>(&test_type_1.super_MessageLite);
  }
  std::__cxx11::string::assign((char *)&local_398);
  testing::Message::Message((Message *)local_378);
  testing::internal::AssertHelper::AssertHelper
            (&local_3a0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
             ,0x57b,local_398);
  testing::internal::AssertHelper::operator=(&local_3a0,(Message *)local_378);
  testing::internal::AssertHelper::~AssertHelper(&local_3a0);
  if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_378[0]._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_378[0]._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl + 8))();
  }
  std::__cxx11::string::~string((string *)&local_398);
  proto2_unittest::TestAllTypesLite::~TestAllTypesLite(&test_type_1);
  return;
}

Assistant:

TEST(LiteTest, DynamicCastMessageInvalidReferenceType) {
  CastType1 test_type_1;
  const MessageLite& test_type_1_pointer_const_ref = test_type_1;
#if defined(ABSL_HAVE_EXCEPTIONS)
  EXPECT_THROW(DynamicCastMessage<CastType2>(test_type_1_pointer_const_ref),
               std::bad_cast);
#elif defined(GTEST_HAS_DEATH_TEST)
  ASSERT_DEATH(
      DynamicCastMessage<CastType2>(test_type_1_pointer_const_ref),
      absl::StrCat("Cannot downcast ", test_type_1.GetTypeName(), " to ",
                   CastType2::default_instance().GetTypeName()));
#else
  (void)test_type_1;
  (void)test_type_1_pointer_const_ref;
  GTEST_SKIP() << "Can't test the failure.";
#endif
}